

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

void __thiscall
TgBot::Api::setWebhook
          (Api *this,string *url,Ptr *certificate,int32_t maxConnection,
          StringArrayPtr *allowedUpdates)

{
  bool bVar1;
  ulong uVar2;
  element_type *__args_1;
  element_type *peVar3;
  element_type *peVar4;
  element_type *objects;
  allocator local_e9;
  string local_e8;
  ptree local_c8;
  anon_class_1_0_00000001 local_99;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_98;
  undefined1 local_78 [8];
  string allowedUpdatesJson;
  undefined1 local_48 [8];
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  StringArrayPtr *allowedUpdates_local;
  Ptr *pPStack_20;
  int32_t maxConnection_local;
  Ptr *certificate_local;
  string *url_local;
  Api *this_local;
  
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)allowedUpdates;
  allowedUpdates_local._4_4_ = maxConnection;
  pPStack_20 = certificate;
  certificate_local = (Ptr *)url;
  url_local = &this->_token;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48,4);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[4],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [4])0x475c27,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               certificate_local);
  }
  bVar1 = std::operator!=(certificate,(nullptr_t)0x0);
  if (bVar1) {
    __args_1 = std::__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)certificate);
    allowedUpdatesJson.field_2._M_local_buf[0xb] = '\x01';
    peVar3 = std::__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)certificate);
    peVar4 = std::__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)certificate);
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[12],std::__cxx11::string&,bool,std::__cxx11::string&,std::__cxx11::string&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [12])0x475d06,&__args_1->data,
               (bool *)(allowedUpdatesJson.field_2._M_local_buf + 0xb),&peVar3->mimeType,
               &peVar4->fileName);
  }
  if (allowedUpdates_local._4_4_ != 0x28) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[16],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [16])"max_connections",(int *)((long)&allowedUpdates_local + 4));
  }
  bVar1 = std::operator!=((shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)args.
                             super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(nullptr_t)0x0);
  if (bVar1) {
    std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<TgBot::Api::setWebhook(std::__cxx11::string_const&,std::shared_ptr<TgBot::InputFile>,int,std::shared_ptr<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)const::__0,void>
              ((function<std::__cxx11::string(std::__cxx11::string_const&)> *)&local_98,&local_99);
    objects = std::
              __shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)args.
                             super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    TgTypeParser::parseArray<std::__cxx11::string>
              ((string *)local_78,(TgTypeParser *)&this->field_0x28,&local_98,objects);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_98);
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[16],std::__cxx11::string&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_48,
               (char (*) [16])"allowed_updates",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    std::__cxx11::string::~string((string *)local_78);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"setWebhook",&local_e9);
  sendRequest(&local_c8,this,&local_e8,
              (vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_48);
  return;
}

Assistant:

void Api::setWebhook(const string& url, const InputFile::Ptr certificate, int32_t maxConnection, const StringArrayPtr &allowedUpdates) const {
    vector<HttpReqArg> args;
    args.reserve(4);
    if (!url.empty()) {
        args.emplace_back("url", url);
    }
    if (certificate != nullptr) {
        args.emplace_back("certificate", certificate->data, true, certificate->mimeType, certificate->fileName);
    }
    if (maxConnection != 40) {
        args.emplace_back("max_connections", maxConnection);
    }
    if (allowedUpdates != nullptr) {
        auto allowedUpdatesJson = _tgTypeParser.parseArray<string>(
            [](const string &s)->string {
                return s;
            }, *allowedUpdates);
        args.emplace_back("allowed_updates", allowedUpdatesJson);
    }

    sendRequest("setWebhook", args);
}